

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O0

void __thiscall QStorageInfo::QStorageInfo(QStorageInfo *this)

{
  QStorageInfoPrivate *this_00;
  QStorageInfoPrivate *in_RDI;
  
  this_00 = (QStorageInfoPrivate *)operator_new(0xa0);
  QStorageInfoPrivate::QStorageInfoPrivate(this_00);
  QExplicitlySharedDataPointer<QStorageInfoPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QStorageInfoPrivate> *)this_00,in_RDI);
  return;
}

Assistant:

QStorageInfo::QStorageInfo()
    : d(new QStorageInfoPrivate)
{
}